

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cpp
# Opt level: O0

bool wasm::Properties::isValidInConstantExpression(Module *wasm,Expression *expr)

{
  bool bVar1;
  RefAs *pRVar2;
  GlobalGet *pGVar3;
  Global *this;
  Binary *pBVar4;
  bool local_51;
  Binary *bin;
  Global *g;
  GlobalGet *get;
  RefAs *refAs;
  Expression *expr_local;
  Module *wasm_local;
  
  bVar1 = isSingleConstantExpression(expr);
  if ((((bVar1) || (bVar1 = Expression::is<wasm::StructNew>(expr), bVar1)) ||
      (bVar1 = Expression::is<wasm::ArrayNew>(expr), bVar1)) ||
     (((bVar1 = Expression::is<wasm::ArrayNewFixed>(expr), bVar1 ||
       (bVar1 = Expression::is<wasm::RefI31>(expr), bVar1)) ||
      (bVar1 = Expression::is<wasm::StringConst>(expr), bVar1)))) {
    wasm_local._7_1_ = true;
  }
  else {
    pRVar2 = Expression::dynCast<wasm::RefAs>(expr);
    if ((pRVar2 == (RefAs *)0x0) ||
       ((pRVar2->op != ExternConvertAny && (pRVar2->op != AnyConvertExtern)))) {
      pGVar3 = Expression::dynCast<wasm::GlobalGet>(expr);
      if (pGVar3 == (GlobalGet *)0x0) {
        bVar1 = FeatureSet::hasExtendedConst(&wasm->features);
        if (((bVar1) && (pBVar4 = Expression::dynCast<wasm::Binary>(expr), pBVar4 != (Binary *)0x0))
           && ((pBVar4->op == AddInt64 ||
               ((((pBVar4->op == SubInt64 || (pBVar4->op == MulInt64)) || (pBVar4->op == AddInt32))
                || ((pBVar4->op == SubInt32 || (pBVar4->op == MulInt32)))))))) {
          wasm_local._7_1_ = true;
        }
        else {
          wasm_local._7_1_ = false;
        }
      }
      else {
        this = Module::getGlobalOrNull(wasm,(Name)(pGVar3->name).super_IString.str);
        if (this == (Global *)0x0) {
          wasm_local._7_1_ = false;
        }
        else if ((this->mutable_ & 1U) == 0) {
          bVar1 = Importable::imported(&this->super_Importable);
          local_51 = true;
          if (!bVar1) {
            local_51 = FeatureSet::hasGC(&wasm->features);
          }
          wasm_local._7_1_ = local_51;
        }
        else {
          wasm_local._7_1_ = false;
        }
      }
    }
    else {
      wasm_local._7_1_ = true;
    }
  }
  return wasm_local._7_1_;
}

Assistant:

static bool isValidInConstantExpression(Module& wasm, Expression* expr) {
  if (isSingleConstantExpression(expr) || expr->is<StructNew>() ||
      expr->is<ArrayNew>() || expr->is<ArrayNewFixed>() || expr->is<RefI31>() ||
      expr->is<StringConst>()) {
    return true;
  }

  if (auto* refAs = expr->dynCast<RefAs>()) {
    if (refAs->op == ExternConvertAny || refAs->op == AnyConvertExtern) {
      return true;
    }
  }

  if (auto* get = expr->dynCast<GlobalGet>()) {
    auto* g = wasm.getGlobalOrNull(get->name);
    // This is called from the validator, so we have to handle non-existent
    // globals gracefully.
    if (!g) {
      return false;
    }
    // Only gets of immutable globals are constant.
    if (g->mutable_) {
      return false;
    }
    // Only imported globals are available in constant expressions unless GC is
    // enabled.
    return g->imported() || wasm.features.hasGC();
    // TODO: Check that there are no cycles between globals.
  }

  if (wasm.features.hasExtendedConst()) {
    if (auto* bin = expr->dynCast<Binary>()) {
      if (bin->op == AddInt64 || bin->op == SubInt64 || bin->op == MulInt64 ||
          bin->op == AddInt32 || bin->op == SubInt32 || bin->op == MulInt32) {
        return true;
      }
    }
  }

  return false;
}